

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_stalker.cpp
# Opt level: O2

int AF_A_StalkerLookInit(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  FState *newstate;
  AActor *this_00;
  char *pcVar3;
  FName *this_01;
  FName local_20;
  FName local_1c;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_0054e20f;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (AActor *)0x0) {
LAB_0054e125:
        this_00 = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0054e20f;
        }
      }
      if (numparam == 1) goto LAB_0054e1a5;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0054e1ff;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              pcVar3 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0054e20f;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0054e1ff;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0054e1a5:
        if (((this_00->flags).Value & 0x200) == 0) {
          pcVar3 = "LookFloor";
          this_01 = &local_20;
        }
        else {
          pcVar3 = "LookCeiling";
          this_01 = &local_1c;
        }
        FName::FName(this_01,pcVar3);
        newstate = AActor::FindState(this_00,this_01);
        if (this_00->state->NextState != newstate) {
          AActor::SetState(this_00,newstate,false);
        }
        return 0;
      }
      pcVar3 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0054e20f;
    }
    if (this_00 == (AActor *)0x0) goto LAB_0054e125;
  }
LAB_0054e1ff:
  pcVar3 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0054e20f:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_stalker.cpp"
                ,0x1f,"int AF_A_StalkerLookInit(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_StalkerLookInit)
{
	PARAM_ACTION_PROLOGUE;

	FState *state;
	if (self->flags & MF_NOGRAVITY)
	{
		state = self->FindState("LookCeiling");
	}
	else
	{
		state = self->FindState("LookFloor");
	}
	if (self->state->NextState != state)
	{
		self->SetState (state);
	}
	return 0;
}